

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderPointsVerification::verifyCorrectAmountOfDuplicateVertices
          (TessellationShaderPointsVerification *this,_run *run,void *run_data,uint run_n_vertices)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  MessageBuilder *pMVar2;
  TestError *this_01;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint n_vertex_b;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  string vertex_spacing;
  undefined1 local_198 [384];
  
  uVar4 = 1;
  iVar5 = 0;
  for (uVar3 = 0; uVar3 != run_n_vertices; uVar3 = uVar3 + 1) {
    uVar6 = (ulong)uVar4;
    uVar7 = uVar6 * 3;
    uVar8 = (ulong)(uint)((int)uVar3 * 3);
    for (; uVar6 < run_n_vertices; uVar6 = uVar6 + 1) {
      uVar9 = uVar7 & 0xffffffff;
      fVar10 = *(float *)((long)run_data + uVar8 * 4) - *(float *)((long)run_data + uVar9 * 4);
      fVar11 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar11 = fVar10;
      }
      if (fVar11 < 1e-05) {
        fVar10 = *(float *)((long)run_data + uVar8 * 4 + 4) -
                 *(float *)((long)run_data + uVar9 * 4 + 4);
        fVar11 = -fVar10;
        if (-fVar10 <= fVar10) {
          fVar11 = fVar10;
        }
        if (fVar11 < 1e-05) {
          fVar10 = *(float *)((long)run_data + uVar8 * 4 + 8) -
                   *(float *)((long)run_data + uVar9 * 4 + 8);
          fVar11 = -fVar10;
          if (-fVar10 <= fVar10) {
            fVar11 = fVar10;
          }
          if (fVar11 < 1e-05) {
            iVar5 = iVar5 + 1;
          }
        }
      }
      uVar7 = uVar7 + 3;
    }
    uVar4 = uVar4 + 1;
  }
  if (iVar5 == 0) {
    return;
  }
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            (&vertex_spacing,(TessellationShaderUtils *)(ulong)run->vertex_spacing,
             (_tessellation_shader_vertex_spacing)run_data);
  local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Duplicate vertices found for the following tesselelation configuration: tessellation level:["
                 );
  pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,run->inner);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->inner + 1);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "], outer tessellation level: [");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer + 1);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer + 2);
  std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer + 3);
  poVar1 = &pMVar2->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"], ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "vertex spacing mode:[");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  vertex_spacing._M_dataplus._M_p);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Duplicate vertex found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
             ,0x419);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderPointsVerification::verifyCorrectAmountOfDuplicateVertices(const _run& run, const void* run_data,
																				  unsigned int run_n_vertices)
{
	const float  epsilon			  = 1e-5f;
	unsigned int n_duplicate_vertices = 0;

	for (unsigned int n_vertex_a = 0; n_vertex_a < run_n_vertices; ++n_vertex_a)
	{
		const float* vertex_a = (const float*)run_data + n_vertex_a * 3; /* components */

		for (unsigned int n_vertex_b = n_vertex_a + 1; n_vertex_b < run_n_vertices; ++n_vertex_b)
		{
			const float* vertex_b = (const float*)run_data + n_vertex_b * 3; /* components */

			if (de::abs(vertex_a[0] - vertex_b[0]) < epsilon && de::abs(vertex_a[1] - vertex_b[1]) < epsilon &&
				de::abs(vertex_a[2] - vertex_b[2]) < epsilon)
			{
				n_duplicate_vertices++;
			}
		} /* for (all vertices) */
	}	 /* for (all vertices) */

	if (n_duplicate_vertices != 0)
	{
		std::string vertex_spacing = TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

		m_testCtx.getLog() << tcu::TestLog::Message << "Duplicate vertices found for the following tesselelation"
													   " configuration: tessellation level:"
													   "["
						   << run.inner[0] << ", " << run.inner[1] << "], "
																	  "outer tessellation level:"
																	  " ["
						   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", " << run.outer[3]
						   << "], "
						   << "vertex spacing mode:[" << vertex_spacing.c_str() << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Duplicate vertex found");
	}
}